

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

void MARGINAL::finish(data *sm)

{
  long lVar1;
  
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(sm->marginals)._M_h);
  if (sm->compete == true) {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(sm->expert_state)._M_h);
  }
  lVar1 = 0x110;
  do {
    features::delete_v((features *)(sm->id_features + lVar1 + -0xe));
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0x6910);
  return;
}

Assistant:

void finish(data& sm)
{
  sm.marginals.~unordered_map();
  if (sm.compete)
    sm.expert_state.~unordered_map();
  for (size_t i = 0; i < 256; i++) sm.temp[i].delete_v();
}